

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

TanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_tan(NeuralNetworkLayer *this)

{
  TanLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x2d0) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2d0;
    this_00 = (TanLayerParams *)operator_new(0x18);
    TanLayerParams::TanLayerParams(this_00);
    (this->layer_).tan_ = this_00;
  }
  return (TanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TanLayerParams* NeuralNetworkLayer::mutable_tan() {
  if (!has_tan()) {
    clear_layer();
    set_has_tan();
    layer_.tan_ = new ::CoreML::Specification::TanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.tan)
  return layer_.tan_;
}